

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
* ska::detailv3::
  empty_default_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
            (void)

{
  if (empty_default_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>()
      ::result == '\0') {
    empty_default_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
              ();
  }
  return empty_default_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
         ::result;
}

Assistant:

sherwood_v3_entry<T> * empty_default_table()
{
    static constexpr int8_t special_end_value = 0;
    static sherwood_v3_entry<T> result[min_lookups] = { {}, {}, {}, {special_end_value} };
    return result;
}